

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O0

void PhyloTree::getCommonEdges
               (PhyloTree *t1,PhyloTree *t2,
               vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *dest)

{
  bool bVar1;
  pointer pPVar2;
  PhyloTreeEdge *in_RDX;
  double dVar3;
  double dVar4;
  PhyloTreeEdge *this;
  back_insert_iterator<std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_> common_bkinstr;
  iterator last2;
  iterator last1;
  iterator first2;
  iterator first1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> t2_edges;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> t1_edges;
  PhyloTreeEdge *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  int in_stack_fffffffffffffdc4;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  in_stack_fffffffffffffdc8;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffddc;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_stack_fffffffffffffde0;
  back_insert_iterator<std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  in_stack_fffffffffffffde8;
  PhyloTree *in_stack_fffffffffffffdf0;
  bool local_1b9;
  back_insert_iterator<std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_> local_150 [15];
  int local_d4;
  double local_d0;
  back_insert_iterator<std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_> local_a0;
  PhyloTreeEdge *local_98;
  PhyloTreeEdge *local_90;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  local_88;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  local_80;
  PhyloTreeEdge *local_78;
  PhyloTreeEdge *local_70;
  PhyloTreeEdge *local_68;
  PhyloTreeEdge *local_60;
  PhyloTreeEdge *local_18;
  
  local_18 = in_RDX;
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector
            ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)0x16f384);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector
            ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)0x16f391);
  getEdges(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8.container);
  getEdges(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8.container);
  local_60 = (PhyloTreeEdge *)
             std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin
                       ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                        in_stack_fffffffffffffdb8);
  local_68 = (PhyloTreeEdge *)
             std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end
                       ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                        in_stack_fffffffffffffdb8);
  std::
  sort<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>>
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  local_70 = (PhyloTreeEdge *)
             std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin
                       ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                        in_stack_fffffffffffffdb8);
  local_78 = (PhyloTreeEdge *)
             std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end
                       ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                        in_stack_fffffffffffffdb8);
  std::
  sort<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>>
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  local_80._M_current =
       (PhyloTreeEdge *)
       std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin(in_stack_fffffffffffffdb8);
  local_88._M_current =
       (PhyloTreeEdge *)
       std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin(in_stack_fffffffffffffdb8);
  local_90 = (PhyloTreeEdge *)
             std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end
                       ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                        in_stack_fffffffffffffdb8);
  local_98 = (PhyloTreeEdge *)
             std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end
                       ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                        in_stack_fffffffffffffdb8);
  local_a0 = std::back_inserter<std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>
                       ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                        in_stack_fffffffffffffdb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                        *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                       (__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                        *)in_stack_fffffffffffffdb8);
    local_1b9 = false;
    if (bVar1) {
      local_1b9 = __gnu_cxx::operator!=
                            ((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                              *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                             (__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                              *)in_stack_fffffffffffffdb8);
    }
    if (local_1b9 == false) break;
    __gnu_cxx::
    __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
    ::operator*(&local_80);
    __gnu_cxx::
    __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
    ::operator*(&local_88);
    bVar1 = Bipartition::operator<
                      ((Bipartition *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                       &in_stack_fffffffffffffdb8->super_Bipartition);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
      ::operator->(&local_80);
      bVar1 = PhyloTreeEdge::isCompatibleWith
                        ((PhyloTreeEdge *)in_stack_fffffffffffffde8.container,
                         in_stack_fffffffffffffde0);
      if (bVar1) {
        __gnu_cxx::
        __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
        ::operator->(&local_80);
        PhyloTreeEdge::asSplit(in_stack_fffffffffffffdb8);
        pPVar2 = __gnu_cxx::
                 __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                 ::operator->(&local_80);
        local_d0 = PhyloTreeEdge::getAttribute(pPVar2);
        pPVar2 = __gnu_cxx::
                 __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                 ::operator->(&local_80);
        local_d4 = PhyloTreeEdge::getOriginalID(pPVar2);
        std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>::
        emplace_back<Bipartition,double,int>
                  (in_stack_fffffffffffffde0,
                   (Bipartition *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                   (double *)in_stack_fffffffffffffdd0._M_current,
                   (int *)in_stack_fffffffffffffdc8._M_current);
        Bipartition::~Bipartition((Bipartition *)0x16f659);
      }
      __gnu_cxx::
      __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
      ::operator++(&local_80);
    }
    else {
      __gnu_cxx::
      __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
      ::operator*(&local_88);
      __gnu_cxx::
      __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
      ::operator*(&local_80);
      bVar1 = Bipartition::operator<
                        ((Bipartition *)
                         CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                         &in_stack_fffffffffffffdb8->super_Bipartition);
      if (bVar1) {
        __gnu_cxx::
        __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
        ::operator->(&local_88);
        bVar1 = PhyloTreeEdge::isCompatibleWith
                          ((PhyloTreeEdge *)in_stack_fffffffffffffde8.container,
                           in_stack_fffffffffffffde0);
        in_stack_fffffffffffffddc = CONCAT13(bVar1,(int3)in_stack_fffffffffffffddc);
        if (bVar1) {
          in_stack_fffffffffffffdd0._M_current = local_18;
          __gnu_cxx::
          __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
          ::operator->(&local_88);
          PhyloTreeEdge::asSplit(in_stack_fffffffffffffdb8);
          pPVar2 = __gnu_cxx::
                   __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                   ::operator->(&local_88);
          in_stack_fffffffffffffdc8._M_current =
               (PhyloTreeEdge *)PhyloTreeEdge::getAttribute(pPVar2);
          pPVar2 = __gnu_cxx::
                   __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                   ::operator->(&local_88);
          in_stack_fffffffffffffdc4 = PhyloTreeEdge::getOriginalID(pPVar2);
          std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>::
          emplace_back<Bipartition,double,int>
                    (in_stack_fffffffffffffde0,
                     (Bipartition *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                     (double *)in_stack_fffffffffffffdd0._M_current,
                     (int *)in_stack_fffffffffffffdc8._M_current);
          Bipartition::~Bipartition((Bipartition *)0x16f936);
        }
      }
      else {
        __gnu_cxx::
        __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
        ::operator->(&local_80);
        PhyloTreeEdge::asSplit(in_stack_fffffffffffffdb8);
        pPVar2 = __gnu_cxx::
                 __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                 ::operator->(&local_80);
        dVar3 = PhyloTreeEdge::getLength(pPVar2);
        pPVar2 = __gnu_cxx::
                 __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                 ::operator->(&local_88);
        dVar4 = PhyloTreeEdge::getLength(pPVar2);
        this = (PhyloTreeEdge *)(dVar3 - dVar4);
        pPVar2 = __gnu_cxx::
                 __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                 ::operator->(&local_80);
        PhyloTreeEdge::getOriginalID(pPVar2);
        PhyloTreeEdge::PhyloTreeEdge
                  (this,(Bipartition *)in_stack_fffffffffffffde8.container,
                   (double)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
        in_stack_fffffffffffffde8 =
             std::back_insert_iterator<std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
             ::operator++(&local_a0,0);
        local_150[0] = in_stack_fffffffffffffde8;
        in_stack_fffffffffffffde0 =
             (vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
             std::back_insert_iterator<std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
             ::operator*(local_150);
        std::back_insert_iterator<std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>::
        operator=((back_insert_iterator<std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                   *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                  in_stack_fffffffffffffdb8);
        PhyloTreeEdge::~PhyloTreeEdge
                  ((PhyloTreeEdge *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
        Bipartition::~Bipartition((Bipartition *)0x16f7fc);
        __gnu_cxx::
        __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
        ::operator++(&local_80);
      }
      __gnu_cxx::
      __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
      ::operator++(&local_88);
    }
  }
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector
            ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
             in_stack_fffffffffffffdd0._M_current);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector
            ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
             in_stack_fffffffffffffdd0._M_current);
  return;
}

Assistant:

void PhyloTree::getCommonEdges(PhyloTree &t1, PhyloTree &t2, vector<PhyloTreeEdge> &dest) {
    vector<PhyloTreeEdge> t1_edges;
    vector<PhyloTreeEdge> t2_edges;
    t1.getEdges(t1_edges);
    t2.getEdges(t2_edges);
    std::sort(t1_edges.begin(), t1_edges.end());
    std::sort(t2_edges.begin(), t2_edges.end());

    auto first1 = t1_edges.begin();
    auto first2 = t2_edges.begin();
    auto last1 = t1_edges.end();
    auto last2 = t2_edges.end();
    auto common_bkinstr = std::back_inserter(dest);

    while (first1 != last1 && first2 != last2) {
        if (*first1 < *first2) {
            if (first1->isCompatibleWith(t2_edges)) {
                dest.emplace_back(first1->asSplit(), first1->getAttribute(), first1->getOriginalID());
            }
            ++first1; // first1 not in list2
        } else {
            if (!(*first2 < *first1)) { // first1 == first2
                *common_bkinstr++ = std::move(PhyloTreeEdge(first1->asSplit(), first1->getLength() - first2->getLength(), first1->getOriginalID()));
                ++first1;
            }
            else { // first2 not in list1
                if (first2->isCompatibleWith(t1_edges)) {
                    dest.emplace_back(first2->asSplit(), first2->getAttribute(), first2->getOriginalID());
                }
            }
            ++first2;
        }
    }
}